

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void google::protobuf::MessageFactory::InternalRegisterGeneratedFile
               (char *filename,RegistrationFunc *register_messages)

{
  bool bVar1;
  GeneratedMessageFactory *pGVar2;
  LogMessage *pLVar3;
  LogFinisher local_59;
  char *local_58;
  RegistrationFunc *local_50;
  LogMessage local_48;
  
  pGVar2 = anon_unknown_0::GeneratedMessageFactory::singleton();
  local_58 = filename;
  local_50 = register_messages;
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<char_const*,void(*)(std::__cxx11::string_const&),google::protobuf::hash<char_const*>,google::protobuf::streq>,char_const*,void(*)(std::__cxx11::string_const&)>
                    (&pGVar2->file_map_,&local_58,
                     (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                      **)&local_50);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message.cc"
               ,0x118);
    pLVar3 = internal::LogMessage::operator<<(&local_48,"File is already registered: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,local_58);
    internal::LogFinisher::operator=(&local_59,pLVar3);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedFile(
    const char* filename, void (*register_messages)(const string&)) {
  GeneratedMessageFactory::singleton()->RegisterFile(filename,
                                                     register_messages);
}